

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O3

MtrNode * Cudd_MakeZddTreeNode(DdManager *dd,uint low,uint size,uint type)

{
  uint uVar1;
  uint uVar2;
  MtrNode *pMVar3;
  uint low_00;
  
  low_00 = low;
  if (low < (uint)dd->sizeZ) {
    low_00 = dd->permZ[low];
  }
  uVar1 = low_00 + size;
  if (-1 < (int)(uVar1 - 1)) {
    pMVar3 = dd->treeZ;
    if (pMVar3 == (MtrNode *)0x0) {
      pMVar3 = Mtr_InitGroupTree(0,dd->sizeZ);
      dd->treeZ = pMVar3;
      if (pMVar3 == (MtrNode *)0x0) {
        return (MtrNode *)0x0;
      }
      pMVar3->index = *dd->invpermZ;
    }
    uVar2 = pMVar3->size;
    if (pMVar3->size < uVar1) {
      uVar2 = uVar1;
    }
    pMVar3->size = uVar2;
    pMVar3 = Mtr_MakeGroup(pMVar3,low_00,size,type);
    if (pMVar3 != (MtrNode *)0x0) {
      pMVar3->index = low;
      return pMVar3;
    }
  }
  return (MtrNode *)0x0;
}

Assistant:

MtrNode *
Cudd_MakeZddTreeNode(
  DdManager * dd /* manager */,
  unsigned int  low /* index of the first group variable */,
  unsigned int  size /* number of variables in the group */,
  unsigned int  type /* MTR_DEFAULT or MTR_FIXED */)
{
    MtrNode *group;
    MtrNode *tree;
    unsigned int level;

    /* If the variable does not exist yet, the position is assumed to be
    ** the same as the index. Therefore, applications that rely on
    ** Cudd_bddNewVarAtLevel or Cudd_addNewVarAtLevel to create new
    ** variables have to create the variables before they group them.
    */
    level = (low < (unsigned int) dd->sizeZ) ? dd->permZ[low] : low;

    if (level + size - 1> (int) MTR_MAXHIGH)
        return(NULL);

    /* If the tree does not exist yet, create it. */
    tree = dd->treeZ;
    if (tree == NULL) {
        dd->treeZ = tree = Mtr_InitGroupTree(0, dd->sizeZ);
        if (tree == NULL)
            return(NULL);
        tree->index = dd->invpermZ[0];
    }

    /* Extend the upper bound of the tree if necessary. This allows the
    ** application to create groups even before the variables are created.
    */
    tree->size = ddMax(tree->size, level + size);

    /* Create the group. */
    group = Mtr_MakeGroup(tree, level, size, type);
    if (group == NULL)
        return(NULL);

    /* Initialize the index field to the index of the variable currently
    ** in position low. This field will be updated by the reordering
    ** procedure to provide a handle to the group once it has been moved.
    */
    group->index = (MtrHalfWord) low;

    return(group);

}